

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

NodeRecord * __thiscall
embree::avx::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>::operator()
          (NodeRecord *__return_storage_ptr__,
          CreateMortonLeaf<4,_embree::InstanceArrayPrimitive> *this,range<unsigned_int> *current,
          CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  uint uVar3;
  RTCFormat RVar4;
  uint uVar5;
  FastAllocator *this_00;
  ThreadLocal *pTVar6;
  ThreadLocal2 *this_01;
  InstanceArray *this_02;
  RawBufferView *pRVar7;
  char *pcVar8;
  MutexSys *pMVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  MutexSys *pMVar11;
  long lVar12;
  Accel *pAVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar35;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  float fVar33;
  float fVar34;
  undefined1 in_ZMM0 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM1 [64];
  float fVar38;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [16];
  float fVar44;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar45;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar51;
  float fVar56;
  float fVar57;
  undefined1 auVar52 [16];
  float fVar58;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar66;
  float fVar67;
  undefined1 auVar64 [16];
  float fVar68;
  undefined1 auVar65 [16];
  float fVar69;
  float fVar72;
  float fVar73;
  undefined1 auVar70 [16];
  float fVar74;
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_ZMM10 [64];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  Lock<embree::MutexSys> local_168;
  ulong local_158;
  MutexSys *local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  range<unsigned_int> *local_100;
  NodeRecord *local_f8;
  Lock<embree::MutexSys> local_f0;
  ThreadLocal2 *local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  auVar29 = in_ZMM13._0_16_;
  auVar28 = in_ZMM12._0_16_;
  auVar27 = in_ZMM11._0_16_;
  auVar26 = in_ZMM10._0_16_;
  auVar30 = in_ZMM1._0_16_;
  uVar2 = current->_begin;
  local_158 = (ulong)(current->_end - uVar2);
  local_150 = (MutexSys *)(local_158 * 8);
  this_00 = alloc->alloc;
  pTVar6 = alloc->talloc1;
  this_01 = pTVar6->parent;
  local_100 = current;
  local_f8 = __return_storage_ptr__;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_f0.locked = true;
    local_f0.mutex = &this_01->mutex;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar19 = ZEXT816(0) << 0x40;
    auVar32 = ZEXT1632(auVar19);
    (this_01->alloc0).end = auVar32._0_8_;
    (this_01->alloc0).allocBlockSize = auVar32._8_8_;
    (this_01->alloc0).bytesUsed = auVar32._16_8_;
    (this_01->alloc0).bytesWasted = auVar32._24_8_;
    (this_01->alloc0).ptr = (char *)auVar32._0_8_;
    (this_01->alloc0).cur = auVar32._8_8_;
    (this_01->alloc0).end = auVar32._16_8_;
    (this_01->alloc0).allocBlockSize = auVar32._24_8_;
    auVar32 = ZEXT1632(auVar19);
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).end = auVar32._0_8_;
      (this_01->alloc1).allocBlockSize = auVar32._8_8_;
      (this_01->alloc1).bytesUsed = auVar32._16_8_;
      (this_01->alloc1).bytesWasted = auVar32._24_8_;
      (this_01->alloc1).ptr = (char *)auVar32._0_8_;
      (this_01->alloc1).cur = auVar32._8_8_;
      (this_01->alloc1).end = auVar32._16_8_;
      (this_01->alloc1).allocBlockSize = auVar32._24_8_;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)auVar32._0_8_;
      (this_01->alloc1).cur = auVar32._8_8_;
      (this_01->alloc1).end = auVar32._16_8_;
      (this_01->alloc1).allocBlockSize = auVar32._24_8_;
      (this_01->alloc1).end = auVar32._0_8_;
      (this_01->alloc1).allocBlockSize = auVar32._8_8_;
      (this_01->alloc1).bytesUsed = auVar32._16_8_;
      (this_01->alloc1).bytesWasted = auVar32._24_8_;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_168.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    local_168.locked = true;
    in_ZMM0 = ZEXT1664(auVar19);
    in_ZMM1 = ZEXT1664(auVar30);
    in_ZMM10 = ZEXT1664(auVar26);
    in_ZMM11 = ZEXT1664(auVar27);
    in_ZMM12 = ZEXT1664(auVar28);
    in_ZMM13 = ZEXT1664(auVar29);
    local_e0 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&this_00->thread_local_allocators,&local_e0);
    Lock<embree::MutexSys>::~Lock(&local_168);
    Lock<embree::MutexSys>::~Lock(&local_f0);
  }
  pMVar11 = local_150;
  pTVar6->bytesUsed = (long)&local_150->mutex + pTVar6->bytesUsed;
  sVar14 = pTVar6->cur;
  uVar15 = (ulong)(-(int)sVar14 & 0xf);
  uVar16 = (long)&local_150->mutex + uVar15 + sVar14;
  pTVar6->cur = uVar16;
  if (pTVar6->end < uVar16) {
    pTVar6->cur = sVar14;
    pMVar9 = (MutexSys *)pTVar6->allocBlockSize;
    if ((MutexSys *)((long)local_150 * 4) < pMVar9 || (long)local_150 * 4 - (long)pMVar9 == 0) {
      local_168.mutex = pMVar9;
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_168);
      pTVar6->ptr = pcVar17;
      sVar14 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
      pTVar6->bytesWasted = sVar14;
      pTVar6->end = (size_t)local_168.mutex;
      pTVar6->cur = (size_t)pMVar11;
      if (local_168.mutex < pMVar11) {
        pTVar6->cur = 0;
        local_168.mutex = (MutexSys *)pTVar6->allocBlockSize;
        pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_168);
        pTVar6->ptr = pcVar17;
        sVar14 = (pTVar6->end - pTVar6->cur) + pTVar6->bytesWasted;
        pTVar6->bytesWasted = sVar14;
        pTVar6->end = (size_t)local_168.mutex;
        pTVar6->cur = (size_t)pMVar11;
        if (local_168.mutex < pMVar11) {
          pTVar6->cur = 0;
          pcVar17 = (char *)0x0;
          goto LAB_00e22b58;
        }
      }
      pTVar6->bytesWasted = sVar14;
    }
    else {
      pcVar17 = (char *)FastAllocator::malloc(this_00,(size_t)&local_150);
    }
  }
  else {
    pTVar6->bytesWasted = pTVar6->bytesWasted + uVar15;
    pcVar17 = pTVar6->ptr + (uVar16 - (long)local_150);
  }
LAB_00e22b58:
  this_02 = this->mesh;
  local_c8._8_4_ = 0x7f800000;
  local_c8._0_8_ = 0x7f8000007f800000;
  local_c8._12_4_ = 0x7f800000;
  local_b8.m128[2] = -INFINITY;
  local_b8._0_8_ = 0xff800000ff800000;
  local_b8.m128[3] = -INFINITY;
  uVar15 = 0;
  while( true ) {
    local_148 = in_ZMM13._0_16_;
    local_118 = in_ZMM10._0_16_;
    local_128 = in_ZMM11._0_16_;
    local_138 = in_ZMM12._0_16_;
    if (local_158 == uVar15) break;
    uVar3 = this->morton[uVar2 + uVar15].field_0.field_0.index;
    uVar16 = (ulong)uVar3;
    if ((*(long *)&(this_02->super_Geometry).field_0x58 != 0) ||
       (*(int *)((this_02->object_ids).super_RawBufferView.ptr_ofs +
                (this_02->object_ids).super_RawBufferView.stride * uVar16) != -1)) {
      pRVar7 = (this_02->l2w_buf).items;
      RVar4 = pRVar7->format;
      if ((this_02->super_Geometry).field_8.field_0x1 == '\x01') {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar12 = pRVar7->stride * uVar16;
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x10)),0x1c);
          local_d8 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x20)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 4)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x14)),0x1c);
          local_88 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x24)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 8)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x18)),0x1c);
          local_98 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x28)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x1c)),0x1c);
          local_a8 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x2c)),0x28);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar12 = pRVar7->stride * uVar16;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(pcVar8 + lVar12 + 4);
          auVar30 = vshufps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12)),auVar30,0x4c);
          local_d8 = vshufps_avx(auVar30,auVar30,0x78);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x10);
          auVar30 = vshufps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0xc)),auVar26,0x4c);
          local_88 = vshufps_avx(auVar30,auVar30,0x78);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x1c);
          auVar30 = vshufps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x18)),auVar27,0x4c);
          local_98 = vshufps_avx(auVar30,auVar30,0x78);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x28);
          auVar30 = vshufps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x24)),auVar28,0x4c);
          local_a8 = vshufps_avx(auVar30,auVar30,0x78);
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar12 = pRVar7->stride * uVar16;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x10);
          auVar30 = vinsertps_avx(auVar29,ZEXT416(*(uint *)(pcVar8 + lVar12 + 8)),0x20);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x34);
          auVar26 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12)),auVar19);
          auVar27 = vshufps_avx(auVar26,auVar19,0xd8);
          auVar54._8_8_ = 0;
          auVar54._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x1c);
          auVar26 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x18)),auVar54);
          auVar28 = vshufps_avx(auVar26,auVar54,0xd8);
          fVar18 = *(float *)(pcVar8 + lVar12 + 0x24);
          fVar33 = *(float *)(pcVar8 + lVar12 + 0x28);
          fVar34 = *(float *)(pcVar8 + lVar12 + 0x2c);
          fVar35 = *(float *)(pcVar8 + lVar12 + 0x30);
          fVar38 = fVar35 * fVar35 + fVar34 * fVar34 + fVar18 * fVar18 + fVar33 * fVar33;
          auVar26 = vrsqrtss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
          fVar42 = auVar26._0_4_;
          fVar38 = fVar42 * 1.5 + fVar42 * fVar42 * fVar42 * fVar38 * -0.5;
          local_a8 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar38 * fVar18)),0x30);
          local_d8 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar38 * fVar33)),0x30);
          auVar26 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 4)),0x10);
          local_98 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar38 * fVar35)),0x30);
          auVar30 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x3c)),0x20);
          local_88 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar38 * fVar34)),0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar12 = pRVar7->stride * uVar16;
          local_d8 = *(undefined1 (*) [16])(pcVar8 + lVar12);
          local_88 = *(undefined1 (*) [16])(pcVar8 + lVar12 + 0x10);
          local_98 = *(undefined1 (*) [16])(pcVar8 + lVar12 + 0x20);
          local_a8 = *(undefined1 (*) [16])(pcVar8 + lVar12 + 0x30);
        }
        auVar30 = vshufps_avx(local_a8,local_a8,0xff);
        auVar26 = vshufps_avx(local_d8,local_d8,0xff);
        auVar27 = vshufps_avx(local_88,local_88,0xff);
        auVar28 = vshufps_avx(local_98,local_98,0xff);
        fVar49 = auVar26._0_4_;
        fVar48 = auVar30._0_4_;
        fVar44 = auVar27._0_4_;
        fVar45 = auVar28._0_4_;
        fVar18 = fVar49 * fVar44 + fVar45 * fVar48;
        fVar35 = fVar49 * fVar44 - fVar45 * fVar48;
        fVar38 = fVar48 * fVar48 - fVar49 * fVar49;
        fVar42 = fVar49 * fVar45 - fVar44 * fVar48;
        fVar33 = fVar49 * fVar45 + fVar44 * fVar48;
        fVar34 = fVar44 * fVar45 + fVar49 * fVar48;
        fVar43 = fVar44 * fVar45 - fVar49 * fVar48;
        auVar30 = ZEXT416((uint)(fVar18 + fVar18));
        auVar30 = vshufps_avx(auVar30,auVar30,0);
        auVar26 = ZEXT416((uint)(fVar42 + fVar42));
        auVar26 = vshufps_avx(auVar26,auVar26,0);
        auVar27 = ZEXT416((uint)(-fVar45 * fVar45 +
                                -fVar44 * fVar44 + fVar48 * fVar48 + fVar49 * fVar49));
        auVar27 = vshufps_avx(auVar27,auVar27,0);
        fVar18 = auVar27._0_4_ * 1.0 + auVar30._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
        fVar42 = auVar27._4_4_ * 0.0 + auVar30._4_4_ * 1.0 + auVar26._4_4_ * 0.0;
        fVar48 = auVar27._8_4_ * 0.0 + auVar30._8_4_ * 0.0 + auVar26._8_4_ * 1.0;
        fVar49 = auVar27._12_4_ * 0.0 + auVar30._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
        auVar30 = ZEXT416((uint)(fVar35 + fVar35));
        auVar30 = vshufps_avx(auVar30,auVar30,0);
        auVar26 = ZEXT416((uint)(-fVar45 * fVar45 + fVar44 * fVar44 + fVar38));
        auVar26 = vshufps_avx(auVar26,auVar26,0);
        auVar27 = ZEXT416((uint)(fVar34 + fVar34));
        auVar27 = vshufps_avx(auVar27,auVar27,0);
        fVar34 = auVar30._0_4_ * 1.0 + auVar26._0_4_ * 0.0 + auVar27._0_4_ * 0.0;
        fVar35 = auVar30._4_4_ * 0.0 + auVar26._4_4_ * 1.0 + auVar27._4_4_ * 0.0;
        fVar50 = auVar30._8_4_ * 0.0 + auVar26._8_4_ * 0.0 + auVar27._8_4_ * 1.0;
        fVar51 = auVar30._12_4_ * 0.0 + auVar26._12_4_ * 0.0 + auVar27._12_4_ * 0.0;
        auVar30 = ZEXT416((uint)(fVar33 + fVar33));
        auVar30 = vshufps_avx(auVar30,auVar30,0);
        auVar26 = ZEXT416((uint)(fVar43 + fVar43));
        auVar26 = vshufps_avx(auVar26,auVar26,0);
        auVar27 = ZEXT416((uint)(fVar45 * fVar45 + -fVar44 * fVar44 + fVar38));
        auVar27 = vshufps_avx(auVar27,auVar27,0);
        fVar33 = auVar30._0_4_ * 1.0 + auVar26._0_4_ * 0.0 + auVar27._0_4_ * 0.0;
        fVar38 = auVar30._4_4_ * 0.0 + auVar26._4_4_ * 1.0 + auVar27._4_4_ * 0.0;
        fVar43 = auVar30._8_4_ * 0.0 + auVar26._8_4_ * 0.0 + auVar27._8_4_ * 1.0;
        fVar44 = auVar30._12_4_ * 0.0 + auVar26._12_4_ * 0.0 + auVar27._12_4_ * 0.0;
        auVar30 = vshufps_avx(local_d8,local_d8,0);
        local_48 = auVar30._0_4_ * fVar18 + fVar34 * 0.0 + fVar33 * 0.0;
        fStack_44 = auVar30._4_4_ * fVar42 + fVar35 * 0.0 + fVar38 * 0.0;
        fStack_40 = auVar30._8_4_ * fVar48 + fVar50 * 0.0 + fVar43 * 0.0;
        fStack_3c = auVar30._12_4_ * fVar49 + fVar51 * 0.0 + fVar44 * 0.0;
        auVar30 = vshufps_avx(local_88,local_88,0);
        auVar26 = vshufps_avx(local_88,local_88,0x55);
        local_58 = auVar30._0_4_ * fVar18 + auVar26._0_4_ * fVar34 + fVar33 * 0.0;
        fStack_54 = auVar30._4_4_ * fVar42 + auVar26._4_4_ * fVar35 + fVar38 * 0.0;
        fStack_50 = auVar30._8_4_ * fVar48 + auVar26._8_4_ * fVar50 + fVar43 * 0.0;
        fStack_4c = auVar30._12_4_ * fVar49 + auVar26._12_4_ * fVar51 + fVar44 * 0.0;
        auVar30 = vshufps_avx(local_98,local_98,0x55);
        auVar26 = vshufps_avx(local_98,local_98,0xaa);
        auVar27 = vshufps_avx(local_98,local_98,0);
        local_68 = auVar27._0_4_ * fVar18 + auVar30._0_4_ * fVar34 + auVar26._0_4_ * fVar33;
        fStack_64 = auVar27._4_4_ * fVar42 + auVar30._4_4_ * fVar35 + auVar26._4_4_ * fVar38;
        fStack_60 = auVar27._8_4_ * fVar48 + auVar30._8_4_ * fVar50 + auVar26._8_4_ * fVar43;
        fStack_5c = auVar27._12_4_ * fVar49 + auVar30._12_4_ * fVar51 + auVar26._12_4_ * fVar44;
        auVar26 = vshufps_avx(local_a8,local_a8,0xaa);
        auVar27 = vshufps_avx(local_a8,local_a8,0x55);
        auVar28 = vshufps_avx(local_a8,local_a8,0);
        auVar30 = vshufps_avx(local_d8,ZEXT416(0) << 0x20,0xe9);
        auVar30 = vblendps_avx(auVar30,local_88,4);
        local_78 = auVar30._0_4_ + 0.0 +
                   auVar28._0_4_ * fVar18 + auVar27._0_4_ * fVar34 + auVar26._0_4_ * fVar33;
        fStack_74 = auVar30._4_4_ + 0.0 +
                    auVar28._4_4_ * fVar42 + auVar27._4_4_ * fVar35 + auVar26._4_4_ * fVar38;
        fStack_70 = auVar30._8_4_ + 0.0 +
                    auVar28._8_4_ * fVar48 + auVar27._8_4_ * fVar50 + auVar26._8_4_ * fVar43;
        fStack_6c = auVar30._12_4_ + 0.0 +
                    auVar28._12_4_ * fVar49 + auVar27._12_4_ * fVar51 + auVar26._12_4_ * fVar44;
        pAVar13 = InstanceArray::getObject(this_02,uVar16);
        auVar26 = vminps_avx((undefined1  [16])
                             (pAVar13->super_AccelData).bounds.bounds0.lower.field_0,
                             (undefined1  [16])
                             (pAVar13->super_AccelData).bounds.bounds1.lower.field_0);
        auVar30 = vmaxps_avx((undefined1  [16])
                             (pAVar13->super_AccelData).bounds.bounds0.upper.field_0,
                             (undefined1  [16])
                             (pAVar13->super_AccelData).bounds.bounds1.upper.field_0);
        auVar27 = vshufps_avx(auVar26,auVar26,0);
        auVar28 = vshufps_avx(auVar26,auVar26,0x55);
        auVar26 = vshufps_avx(auVar26,auVar26,0xaa);
        fVar18 = local_78 + local_68 * auVar26._0_4_;
        fVar33 = fStack_74 + fStack_64 * auVar26._4_4_;
        fVar34 = fStack_70 + fStack_60 * auVar26._8_4_;
        fVar35 = fStack_6c + fStack_5c * auVar26._12_4_;
        fVar45 = local_58 * auVar28._0_4_;
        fVar48 = fStack_54 * auVar28._4_4_;
        fVar49 = fStack_50 * auVar28._8_4_;
        fVar50 = fStack_4c * auVar28._12_4_;
        fVar51 = fVar45 + fVar18;
        fVar56 = fVar48 + fVar33;
        fVar57 = fVar49 + fVar34;
        fVar58 = fVar50 + fVar35;
        fVar38 = local_48 * auVar27._0_4_;
        fVar42 = fStack_44 * auVar27._4_4_;
        fVar43 = fStack_40 * auVar27._8_4_;
        fVar44 = fStack_3c * auVar27._12_4_;
        auVar60._0_4_ = fVar38 + fVar51;
        auVar60._4_4_ = fVar42 + fVar56;
        auVar60._8_4_ = fVar43 + fVar57;
        auVar60._12_4_ = fVar44 + fVar58;
        auVar62._8_4_ = 0x7f800000;
        auVar62._0_8_ = 0x7f8000007f800000;
        auVar62._12_4_ = 0x7f800000;
        auVar27 = vminps_avx(auVar62,auVar60);
        auVar65._8_4_ = 0xff800000;
        auVar65._0_8_ = 0xff800000ff800000;
        auVar65._12_4_ = 0xff800000;
        auVar26 = vmaxps_avx(auVar65,auVar60);
        auVar28 = vshufps_avx(auVar30,auVar30,0xaa);
        fVar63 = local_78 + local_68 * auVar28._0_4_;
        fVar66 = fStack_74 + fStack_64 * auVar28._4_4_;
        fVar67 = fStack_70 + fStack_60 * auVar28._8_4_;
        fVar68 = fStack_6c + fStack_5c * auVar28._12_4_;
        fVar45 = fVar45 + fVar63;
        fVar48 = fVar48 + fVar66;
        fVar49 = fVar49 + fVar67;
        fVar50 = fVar50 + fVar68;
        auVar71._0_4_ = fVar38 + fVar45;
        auVar71._4_4_ = fVar42 + fVar48;
        auVar71._8_4_ = fVar43 + fVar49;
        auVar71._12_4_ = fVar44 + fVar50;
        auVar27 = vminps_avx(auVar27,auVar71);
        auVar26 = vmaxps_avx(auVar26,auVar71);
        auVar28 = vshufps_avx(auVar30,auVar30,0x55);
        fVar69 = auVar28._0_4_ * local_58;
        fVar72 = auVar28._4_4_ * fStack_54;
        fVar73 = auVar28._8_4_ * fStack_50;
        fVar74 = auVar28._12_4_ * fStack_4c;
        fVar18 = fVar69 + fVar18;
        fVar33 = fVar72 + fVar33;
        fVar34 = fVar73 + fVar34;
        fVar35 = fVar74 + fVar35;
        auVar76._0_4_ = fVar38 + fVar18;
        auVar76._4_4_ = fVar42 + fVar33;
        auVar76._8_4_ = fVar43 + fVar34;
        auVar76._12_4_ = fVar44 + fVar35;
        auVar27 = vminps_avx(auVar27,auVar76);
        auVar26 = vmaxps_avx(auVar26,auVar76);
        fVar69 = fVar69 + fVar63;
        fVar72 = fVar72 + fVar66;
        fVar73 = fVar73 + fVar67;
        fVar74 = fVar74 + fVar68;
        auVar41._0_4_ = fVar38 + fVar69;
        auVar41._4_4_ = fVar42 + fVar72;
        auVar41._8_4_ = fVar43 + fVar73;
        auVar41._12_4_ = fVar44 + fVar74;
        auVar27 = vminps_avx(auVar27,auVar41);
        auVar26 = vmaxps_avx(auVar26,auVar41);
        auVar30 = vshufps_avx(auVar30,auVar30,0);
        fVar38 = local_48 * auVar30._0_4_;
        fVar42 = fStack_44 * auVar30._4_4_;
        fVar43 = fStack_40 * auVar30._8_4_;
        fVar44 = fStack_3c * auVar30._12_4_;
        auVar55._0_4_ = fVar38 + fVar51;
        auVar55._4_4_ = fVar42 + fVar56;
        auVar55._8_4_ = fVar43 + fVar57;
        auVar55._12_4_ = fVar44 + fVar58;
        auVar27 = vminps_avx(auVar27,auVar55);
        auVar30 = vmaxps_avx(auVar26,auVar55);
        auVar47._0_4_ = fVar38 + fVar45;
        auVar47._4_4_ = fVar42 + fVar48;
        auVar47._8_4_ = fVar43 + fVar49;
        auVar47._12_4_ = fVar44 + fVar50;
        auVar26 = vminps_avx(auVar27,auVar47);
        auVar30 = vmaxps_avx(auVar30,auVar47);
        auVar31._0_4_ = fVar38 + fVar18;
        auVar31._4_4_ = fVar42 + fVar33;
        auVar31._8_4_ = fVar43 + fVar34;
        auVar31._12_4_ = fVar44 + fVar35;
        auVar26 = vminps_avx(auVar26,auVar31);
        auVar30 = vmaxps_avx(auVar30,auVar31);
        auVar37._0_4_ = fVar38 + fVar69;
        auVar37._4_4_ = fVar42 + fVar72;
        auVar37._8_4_ = fVar43 + fVar73;
        auVar37._12_4_ = fVar44 + fVar74;
        auVar26 = vminps_avx(auVar26,auVar37);
        in_ZMM0 = ZEXT1664(auVar26);
        auVar30 = vmaxps_avx(auVar30,auVar37);
        in_ZMM1 = ZEXT1664(auVar30);
        in_ZMM10 = ZEXT1664(local_118);
        in_ZMM11 = ZEXT1664(local_128);
        in_ZMM12 = ZEXT1664(local_138);
        in_ZMM13 = ZEXT1664(local_148);
      }
      else {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar12 = pRVar7->stride * uVar16;
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x10)),0x1c);
          local_118 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x20)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 4)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x14)),0x1c);
          local_128 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x24)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 8)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x18)),0x1c);
          local_138 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x28)),0x28);
          auVar30 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x1c)),0x1c);
          local_148 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x2c)),0x28);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar12 = pRVar7->stride * uVar16;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(pcVar8 + lVar12 + 4);
          auVar30 = vshufps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12)),auVar20,0x4c);
          local_118 = vshufps_avx(auVar30,auVar30,0x78);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x10);
          auVar30 = vshufps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0xc)),auVar21,0x4c);
          local_128 = vshufps_avx(auVar30,auVar30,0x78);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x1c);
          auVar30 = vshufps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x18)),auVar22,0x4c);
          local_138 = vshufps_avx(auVar30,auVar30,0x78);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x28);
          auVar30 = vshufps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x24)),auVar23,0x4c);
          local_148 = vshufps_avx(auVar30,auVar30,0x78);
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar12 = pRVar7->stride * uVar16;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x10);
          auVar30 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(pcVar8 + lVar12 + 8)),0x20);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x34);
          auVar26 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12)),auVar39);
          auVar27 = vshufps_avx(auVar26,auVar39,0xd8);
          auVar52._8_8_ = 0;
          auVar52._0_8_ = *(ulong *)(pcVar8 + lVar12 + 0x1c);
          auVar26 = vmovlhps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x18)),auVar52);
          auVar28 = vshufps_avx(auVar26,auVar52,0xd8);
          fVar18 = *(float *)(pcVar8 + lVar12 + 0x24);
          fVar33 = *(float *)(pcVar8 + lVar12 + 0x28);
          fVar34 = *(float *)(pcVar8 + lVar12 + 0x2c);
          fVar35 = *(float *)(pcVar8 + lVar12 + 0x30);
          fVar38 = fVar35 * fVar35 + fVar34 * fVar34 + fVar18 * fVar18 + fVar33 * fVar33;
          auVar26 = vrsqrtss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
          fVar42 = auVar26._0_4_;
          fVar38 = fVar42 * 1.5 + fVar42 * fVar42 * fVar42 * fVar38 * -0.5;
          local_148 = vinsertps_avx(auVar28,ZEXT416((uint)(fVar38 * fVar18)),0x30);
          local_118 = vinsertps_avx(auVar27,ZEXT416((uint)(fVar38 * fVar33)),0x30);
          auVar26 = vinsertps_avx(ZEXT416(*(uint *)(pcVar8 + lVar12 + 0xc)),
                                  ZEXT416(*(uint *)(pcVar8 + lVar12 + 4)),0x10);
          local_138 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar38 * fVar35)),0x30);
          auVar30 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(pcVar8 + lVar12 + 0x3c)),0x20);
          local_128 = vinsertps_avx(auVar30,ZEXT416((uint)(fVar38 * fVar34)),0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar12 = pRVar7->stride * uVar16;
          local_118 = *(undefined1 (*) [16])(pcVar8 + lVar12);
          local_128 = *(undefined1 (*) [16])(pcVar8 + lVar12 + 0x10);
          local_138 = *(undefined1 (*) [16])(pcVar8 + lVar12 + 0x20);
          local_148 = *(undefined1 (*) [16])(pcVar8 + lVar12 + 0x30);
        }
        pAVar13 = InstanceArray::getObject(this_02,uVar16);
        in_ZMM13 = ZEXT1664(local_148);
        in_ZMM12 = ZEXT1664(local_138);
        in_ZMM11 = ZEXT1664(local_128);
        in_ZMM10 = ZEXT1664(local_118);
        auVar26 = vminps_avx((undefined1  [16])
                             (pAVar13->super_AccelData).bounds.bounds0.lower.field_0,
                             (undefined1  [16])
                             (pAVar13->super_AccelData).bounds.bounds1.lower.field_0);
        auVar30 = vmaxps_avx((undefined1  [16])
                             (pAVar13->super_AccelData).bounds.bounds0.upper.field_0,
                             (undefined1  [16])
                             (pAVar13->super_AccelData).bounds.bounds1.upper.field_0);
        auVar27 = vshufps_avx(auVar26,auVar26,0);
        auVar28 = vshufps_avx(auVar26,auVar26,0x55);
        auVar26 = vshufps_avx(auVar26,auVar26,0xaa);
        fVar18 = local_148._0_4_ + local_138._0_4_ * auVar26._0_4_;
        fVar33 = local_148._4_4_ + local_138._4_4_ * auVar26._4_4_;
        fVar34 = local_148._8_4_ + local_138._8_4_ * auVar26._8_4_;
        fVar35 = local_148._12_4_ + local_138._12_4_ * auVar26._12_4_;
        fVar45 = local_128._0_4_ * auVar28._0_4_;
        fVar48 = local_128._4_4_ * auVar28._4_4_;
        fVar49 = local_128._8_4_ * auVar28._8_4_;
        fVar50 = local_128._12_4_ * auVar28._12_4_;
        fVar51 = fVar45 + fVar18;
        fVar56 = fVar48 + fVar33;
        fVar57 = fVar49 + fVar34;
        fVar58 = fVar50 + fVar35;
        fVar38 = local_118._0_4_ * auVar27._0_4_;
        fVar42 = local_118._4_4_ * auVar27._4_4_;
        fVar43 = local_118._8_4_ * auVar27._8_4_;
        fVar44 = local_118._12_4_ * auVar27._12_4_;
        auVar59._0_4_ = fVar38 + fVar51;
        auVar59._4_4_ = fVar42 + fVar56;
        auVar59._8_4_ = fVar43 + fVar57;
        auVar59._12_4_ = fVar44 + fVar58;
        auVar61._8_4_ = 0x7f800000;
        auVar61._0_8_ = 0x7f8000007f800000;
        auVar61._12_4_ = 0x7f800000;
        auVar27 = vminps_avx(auVar61,auVar59);
        auVar64._8_4_ = 0xff800000;
        auVar64._0_8_ = 0xff800000ff800000;
        auVar64._12_4_ = 0xff800000;
        auVar26 = vmaxps_avx(auVar64,auVar59);
        auVar28 = vshufps_avx(auVar30,auVar30,0xaa);
        fVar63 = local_148._0_4_ + local_138._0_4_ * auVar28._0_4_;
        fVar66 = local_148._4_4_ + local_138._4_4_ * auVar28._4_4_;
        fVar67 = local_148._8_4_ + local_138._8_4_ * auVar28._8_4_;
        fVar68 = local_148._12_4_ + local_138._12_4_ * auVar28._12_4_;
        fVar45 = fVar45 + fVar63;
        fVar48 = fVar48 + fVar66;
        fVar49 = fVar49 + fVar67;
        fVar50 = fVar50 + fVar68;
        auVar70._0_4_ = fVar38 + fVar45;
        auVar70._4_4_ = fVar42 + fVar48;
        auVar70._8_4_ = fVar43 + fVar49;
        auVar70._12_4_ = fVar44 + fVar50;
        auVar27 = vminps_avx(auVar27,auVar70);
        auVar26 = vmaxps_avx(auVar26,auVar70);
        auVar28 = vshufps_avx(auVar30,auVar30,0x55);
        fVar69 = local_128._0_4_ * auVar28._0_4_;
        fVar72 = local_128._4_4_ * auVar28._4_4_;
        fVar73 = local_128._8_4_ * auVar28._8_4_;
        fVar74 = local_128._12_4_ * auVar28._12_4_;
        fVar18 = fVar69 + fVar18;
        fVar33 = fVar72 + fVar33;
        fVar34 = fVar73 + fVar34;
        fVar35 = fVar74 + fVar35;
        auVar75._0_4_ = fVar38 + fVar18;
        auVar75._4_4_ = fVar42 + fVar33;
        auVar75._8_4_ = fVar43 + fVar34;
        auVar75._12_4_ = fVar44 + fVar35;
        auVar27 = vminps_avx(auVar27,auVar75);
        auVar26 = vmaxps_avx(auVar26,auVar75);
        fVar69 = fVar69 + fVar63;
        fVar72 = fVar72 + fVar66;
        fVar73 = fVar73 + fVar67;
        fVar74 = fVar74 + fVar68;
        auVar40._0_4_ = fVar38 + fVar69;
        auVar40._4_4_ = fVar42 + fVar72;
        auVar40._8_4_ = fVar43 + fVar73;
        auVar40._12_4_ = fVar44 + fVar74;
        auVar27 = vminps_avx(auVar27,auVar40);
        auVar26 = vmaxps_avx(auVar26,auVar40);
        auVar30 = vshufps_avx(auVar30,auVar30,0);
        fVar38 = local_118._0_4_ * auVar30._0_4_;
        fVar42 = local_118._4_4_ * auVar30._4_4_;
        fVar43 = local_118._8_4_ * auVar30._8_4_;
        fVar44 = local_118._12_4_ * auVar30._12_4_;
        auVar53._0_4_ = fVar51 + fVar38;
        auVar53._4_4_ = fVar56 + fVar42;
        auVar53._8_4_ = fVar57 + fVar43;
        auVar53._12_4_ = fVar58 + fVar44;
        auVar27 = vminps_avx(auVar27,auVar53);
        auVar30 = vmaxps_avx(auVar26,auVar53);
        auVar46._0_4_ = fVar38 + fVar45;
        auVar46._4_4_ = fVar42 + fVar48;
        auVar46._8_4_ = fVar43 + fVar49;
        auVar46._12_4_ = fVar44 + fVar50;
        auVar26 = vminps_avx(auVar27,auVar46);
        auVar30 = vmaxps_avx(auVar30,auVar46);
        auVar25._0_4_ = fVar38 + fVar18;
        auVar25._4_4_ = fVar42 + fVar33;
        auVar25._8_4_ = fVar43 + fVar34;
        auVar25._12_4_ = fVar44 + fVar35;
        auVar26 = vminps_avx(auVar26,auVar25);
        auVar30 = vmaxps_avx(auVar30,auVar25);
        auVar36._0_4_ = fVar38 + fVar69;
        auVar36._4_4_ = fVar42 + fVar72;
        auVar36._8_4_ = fVar43 + fVar73;
        auVar36._12_4_ = fVar44 + fVar74;
        auVar26 = vminps_avx(auVar26,auVar36);
        in_ZMM0 = ZEXT1664(auVar26);
        auVar30 = vmaxps_avx(auVar30,auVar36);
        in_ZMM1 = ZEXT1664(auVar30);
      }
    }
    local_c8 = vminps_avx(local_c8,in_ZMM0._0_16_);
    local_b8.m128 = (__m128)vmaxps_avx(local_b8.m128,in_ZMM1._0_16_);
    uVar5 = this->geomID_;
    *(uint *)(pcVar17 + uVar15 * 8) = uVar3;
    *(uint *)(pcVar17 + uVar15 * 8 + 4) = uVar5;
    uVar15 = uVar15 + 1;
  }
  uVar15 = 7;
  if (local_158 < 7) {
    uVar15 = local_158;
  }
  aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
           vinsertps_avx(local_c8,ZEXT416(local_100->_end - local_100->_begin),0x30);
  (local_f8->ref).ptr = uVar15 | (ulong)pcVar17 | 8;
  (local_f8->bounds).lower.field_0 = aVar10;
  (local_f8->bounds).upper.field_0 = local_b8;
  return local_f8;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items <= 1);

        /* allocate leaf node */
        InstanceArrayPrimitive* accel = (InstanceArrayPrimitive*) alloc.malloc1(items*sizeof(InstanceArrayPrimitive),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const InstanceArray* instance = this->mesh;

        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          bounds.extend(instance->bounds(primID));
          new (&accel[i]) InstanceArrayPrimitive(geomID_, primID);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }